

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_netstd_generator.cc
# Opt level: O0

void __thiscall
t_netstd_generator::generate_netstd_property
          (t_netstd_generator *this,ostream *out,t_field *tfield,bool isPublic,bool generateIsset,
          string *fieldPrefix)

{
  t_field *ptVar1;
  bool bVar2;
  ostream *poVar3;
  t_type *ttype;
  string *psVar4;
  char *pcVar5;
  string local_2c8;
  string local_2a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_288;
  string local_268;
  string local_248;
  string local_228;
  string local_208;
  string local_1e8;
  string local_1c8;
  string local_1a8;
  string local_188;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  string local_148;
  string local_128;
  string local_108;
  string local_e8;
  undefined1 local_c1;
  undefined1 local_c0 [7];
  bool is_required;
  string local_a0;
  string local_80;
  string local_50;
  string *local_30;
  string *fieldPrefix_local;
  bool generateIsset_local;
  t_field *ptStack_20;
  bool isPublic_local;
  t_field *tfield_local;
  ostream *out_local;
  t_netstd_generator *this_local;
  
  local_30 = fieldPrefix;
  fieldPrefix_local._6_1_ = generateIsset;
  fieldPrefix_local._7_1_ = isPublic;
  ptStack_20 = tfield;
  tfield_local = (t_field *)out;
  out_local = (ostream *)this;
  bVar2 = is_serialize_enabled(this);
  if (((bVar2) || (bVar2 = is_wcf_enabled(this), bVar2)) &&
     (ptVar1 = tfield_local, (fieldPrefix_local._7_1_ & 1) != 0)) {
    t_generator::indent_abi_cxx11_(&local_50,(t_generator *)this);
    poVar3 = std::operator<<((ostream *)ptVar1,(string *)&local_50);
    poVar3 = std::operator<<(poVar3,"[DataMember(Order = 0)]");
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_50);
  }
  ptVar1 = tfield_local;
  t_generator::indent_abi_cxx11_(&local_80,(t_generator *)this);
  poVar3 = std::operator<<((ostream *)ptVar1,(string *)&local_80);
  pcVar5 = "private ";
  if ((fieldPrefix_local._7_1_ & 1) != 0) {
    pcVar5 = "public ";
  }
  poVar3 = std::operator<<(poVar3,pcVar5);
  ttype = t_field::get_type(ptStack_20);
  type_name_abi_cxx11_(&local_a0,this,ttype,true);
  poVar3 = std::operator<<(poVar3,(string *)&local_a0);
  poVar3 = std::operator<<(poVar3," ");
  prop_name_abi_cxx11_((string *)local_c0,this,ptStack_20,false);
  std::operator<<(poVar3,(string *)local_c0);
  std::__cxx11::string::~string((string *)local_c0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_80);
  local_c1 = field_is_required(ptStack_20);
  if ((bool)local_c1) {
    poVar3 = std::operator<<((ostream *)tfield_local," { get; set; }");
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  }
  else {
    poVar3 = std::operator<<((ostream *)tfield_local,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&local_e8,(t_generator *)this);
    poVar3 = std::operator<<(poVar3,(string *)&local_e8);
    poVar3 = std::operator<<(poVar3,"{");
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_e8);
    t_generator::indent_up((t_generator *)this);
    ptVar1 = tfield_local;
    t_generator::indent_abi_cxx11_(&local_108,(t_generator *)this);
    poVar3 = std::operator<<((ostream *)ptVar1,(string *)&local_108);
    poVar3 = std::operator<<(poVar3,"get");
    poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&local_128,(t_generator *)this);
    poVar3 = std::operator<<(poVar3,(string *)&local_128);
    poVar3 = std::operator<<(poVar3,"{");
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_128);
    std::__cxx11::string::~string((string *)&local_108);
    t_generator::indent_up((t_generator *)this);
    ptVar1 = tfield_local;
    t_generator::indent_abi_cxx11_(&local_148,(t_generator *)this);
    poVar3 = std::operator<<((ostream *)ptVar1,(string *)&local_148);
    poVar3 = std::operator<<(poVar3,"return ");
    psVar4 = t_field::get_name_abi_cxx11_(ptStack_20);
    std::operator+(&local_168,fieldPrefix,psVar4);
    poVar3 = std::operator<<(poVar3,(string *)&local_168);
    poVar3 = std::operator<<(poVar3,";");
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_168);
    std::__cxx11::string::~string((string *)&local_148);
    t_generator::indent_down((t_generator *)this);
    ptVar1 = tfield_local;
    t_generator::indent_abi_cxx11_(&local_188,(t_generator *)this);
    poVar3 = std::operator<<((ostream *)ptVar1,(string *)&local_188);
    poVar3 = std::operator<<(poVar3,"}");
    poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&local_1a8,(t_generator *)this);
    poVar3 = std::operator<<(poVar3,(string *)&local_1a8);
    poVar3 = std::operator<<(poVar3,"set");
    poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&local_1c8,(t_generator *)this);
    poVar3 = std::operator<<(poVar3,(string *)&local_1c8);
    poVar3 = std::operator<<(poVar3,"{");
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_1c8);
    std::__cxx11::string::~string((string *)&local_1a8);
    std::__cxx11::string::~string((string *)&local_188);
    t_generator::indent_up((t_generator *)this);
    ptVar1 = tfield_local;
    if ((fieldPrefix_local._6_1_ & 1) != 0) {
      t_generator::indent_abi_cxx11_(&local_1e8,(t_generator *)this);
      poVar3 = std::operator<<((ostream *)ptVar1,(string *)&local_1e8);
      poVar3 = std::operator<<(poVar3,"__isset.");
      psVar4 = t_field::get_name_abi_cxx11_(ptStack_20);
      std::__cxx11::string::string((string *)&local_248,(string *)psVar4);
      normalize_name(&local_228,this,&local_248,false);
      get_isset_name(&local_208,this,&local_228);
      poVar3 = std::operator<<(poVar3,(string *)&local_208);
      poVar3 = std::operator<<(poVar3," = true;");
      std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_208);
      std::__cxx11::string::~string((string *)&local_228);
      std::__cxx11::string::~string((string *)&local_248);
      std::__cxx11::string::~string((string *)&local_1e8);
    }
    ptVar1 = tfield_local;
    t_generator::indent_abi_cxx11_(&local_268,(t_generator *)this);
    poVar3 = std::operator<<((ostream *)ptVar1,(string *)&local_268);
    poVar3 = std::operator<<(poVar3,"this.");
    psVar4 = t_field::get_name_abi_cxx11_(ptStack_20);
    std::operator+(&local_288,fieldPrefix,psVar4);
    poVar3 = std::operator<<(poVar3,(string *)&local_288);
    poVar3 = std::operator<<(poVar3," = value;");
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_288);
    std::__cxx11::string::~string((string *)&local_268);
    t_generator::indent_down((t_generator *)this);
    ptVar1 = tfield_local;
    t_generator::indent_abi_cxx11_(&local_2a8,(t_generator *)this);
    poVar3 = std::operator<<((ostream *)ptVar1,(string *)&local_2a8);
    poVar3 = std::operator<<(poVar3,"}");
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_2a8);
    t_generator::indent_down((t_generator *)this);
    ptVar1 = tfield_local;
    t_generator::indent_abi_cxx11_(&local_2c8,(t_generator *)this);
    poVar3 = std::operator<<((ostream *)ptVar1,(string *)&local_2c8);
    poVar3 = std::operator<<(poVar3,"}");
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_2c8);
  }
  std::operator<<((ostream *)tfield_local,(string *)&::endl_abi_cxx11_);
  return;
}

Assistant:

void t_netstd_generator::generate_netstd_property(ostream& out, t_field* tfield, bool isPublic, bool generateIsset, string fieldPrefix)
{
    if ((is_serialize_enabled() || is_wcf_enabled()) && isPublic)
    {
        out << indent() << "[DataMember(Order = 0)]" << endl;
    }
    out << indent() << (isPublic ? "public " : "private ") << type_name(tfield->get_type()) << " " << prop_name(tfield);

    bool is_required = field_is_required(tfield);
    if (is_required)
    {
        out << " { get; set; }" << endl;
    }
    else
    {
        out << endl
            << indent() << "{" << endl;
        indent_up();

        out << indent() << "get" << endl
            << indent() << "{" << endl;
        indent_up();

        out << indent() << "return " << fieldPrefix + tfield->get_name() << ";" << endl;
        indent_down();
        out << indent() << "}" << endl
            << indent() << "set" << endl
            << indent() << "{" << endl;
        indent_up();

        if (generateIsset)
        {
            out << indent() << "__isset." << get_isset_name(normalize_name(tfield->get_name())) << " = true;" << endl;
        }
        out << indent() << "this." << fieldPrefix + tfield->get_name() << " = value;" << endl;

        indent_down();
        out << indent() << "}" << endl;
        indent_down();
        out << indent() << "}" << endl;
    }
    out << endl;
}